

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnvironmentType *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,(ushort)this->m_ui8EntityKind);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Domain);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Class);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Category);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SubCategory);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Specific);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Extra);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString EnvironmentType::GetAsString() const
{
    KStringStream ss;

    ss << ( KUINT16 )m_ui8EntityKind  << " , "
       << ( KUINT16 )m_ui8Domain      << " , "
       << ( KUINT16 )m_ui16Class      << " , "
       << ( KUINT16 )m_ui8Category    << " , "
       << ( KUINT16 )m_ui8SubCategory << " , "
       << ( KUINT16 )m_ui8Specific    << " , "
       << ( KUINT16 )m_ui8Extra
       << "\n";

    return ss.str();
}